

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O1

void pulse_prog_formian_queen(CHAR_DATA *mob)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj;
  OBJ_AFFECT_DATA oaf;
  AFFECT_DATA af;
  OBJ_AFFECT_DATA local_e8;
  AFFECT_DATA local_98;
  
  if (((mob->in_room != (ROOM_INDEX_DATA *)0x0) && (mob->fighting == (CHAR_DATA *)0x0)) &&
     (bVar2 = is_affected(mob,(int)gsn_timer), !bVar2)) {
    iVar3 = number_range(1,10);
    if (iVar3 - 1U < 10) {
      sVar1 = *(short *)(&DAT_003bd410 + (ulong)(iVar3 - 1U) * 2);
    }
    else {
      sVar1 = 0;
    }
    pObjIndex = get_obj_index(0);
    obj = create_object(pObjIndex,0);
    obj_to_room(obj,mob->in_room);
    init_affect(&local_98);
    local_98.where = 0;
    local_98.aftype = 7;
    local_98.type = gsn_timer;
    local_98.duration = 0x14;
    affect_to_char(mob,&local_98);
    init_affect_obj(&local_e8);
    local_e8.where = 0;
    local_e8.type = gsn_timer;
    local_e8.aftype = 7;
    local_e8.end_fun = formian_egg_hatch;
    local_e8.duration = sVar1;
    affect_to_obj(obj,&local_e8);
  }
  return;
}

Assistant:

void pulse_prog_formian_queen(CHAR_DATA *mob)
{
	int rand, vnum = 0, incubation = 0;
	AFFECT_DATA af;
	OBJ_AFFECT_DATA oaf;
	OBJ_DATA *egg;

	if (!mob->in_room)
		return;

	if (mob->fighting)
		return;

	if (is_affected(mob, gsn_timer))
		return;

	rand = number_range(1, 10);

	switch (rand)
	{
		case 1:
		case 2:
		case 3:
		case 4:
			vnum = 3212; // worker
			incubation = 35;
			break;
		case 5:
		case 6:
		case 7:
			vnum = 3213; // warrior
			incubation = 45;
			break;
		case 8:
		case 9:
			vnum = 3214; // taskmaster
			incubation = 55;
			break;
		case 10:
			vnum = 3215; // queen guard
			incubation = 65;
			break;
		default:
			vnum = 3212;
			break;
	}

	egg = create_object(get_obj_index(vnum), 0);
	obj_to_room(egg, mob->in_room);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_TIMER;
	af.type = gsn_timer;
	af.duration = 20;
	affect_to_char(mob, &af);

	init_affect_obj(&oaf);
	oaf.where = TO_OBJ_AFFECTS;
	oaf.type = gsn_timer;
	oaf.aftype = AFT_TIMER;
	oaf.duration = incubation;
	oaf.end_fun = formian_egg_hatch;
	affect_to_obj(egg, &oaf);
}